

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O3

void TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)28,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  TTDVar pvVar1;
  
  if (evt->EventKind == CreateURIErrorActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar1 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar1;
    pvVar1 = NSSnapValues::ParseTTDVar(true,reader);
    evt[1].EventTimeStamp = (int64)pvVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTVarsArgumentAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarsArgumentAction_InternalUse<count>* vAction = GetInlineEventDataAs<JsRTVarsArgumentAction_InternalUse<count>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            if(count == 1)
            {
                vAction->VarArray[0] = NSSnapValues::ParseTTDVar(true, reader);
            }
            else
            {
                reader->ReadSequenceStart_WDefaultKey(true);
                for(size_t i = 0; i < count; ++i)
                {
                    vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }
        }